

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void vkt::Draw::createTopologyGroups(TestCaseGroup *testGroup,DrawCommandType cmdType)

{
  TestContext *testCtx;
  char *__s;
  TestNode *node;
  TestContext *pTVar1;
  long lVar2;
  allocator<char> local_99;
  TestNode *local_98;
  string local_90;
  string groupName;
  string local_50;
  
  pTVar1 = (TestContext *)(ulong)cmdType;
  lVar2 = 0;
  local_98 = &testGroup->super_TestNode;
  for (; lVar2 != 10; lVar2 = lVar2 + 1) {
    __s = ::vk::getPrimitiveTopologyName((VkPrimitiveTopology)lVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_99);
    de::toLower(&local_90,&local_50);
    std::__cxx11::string::substr((ulong)&groupName,(ulong)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Testcases with a specific topology.",
               (allocator<char> *)&local_50);
    testCtx = local_98->m_testCtx;
    node = (TestNode *)operator_new(0x80);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,groupName._M_dataplus._M_p,local_90._M_dataplus._M_p);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bd7f98;
    node[1]._vptr_TestNode = (_func_int **)populateSubGroup;
    node[1].m_testCtx = pTVar1;
    tcu::TestNode::addChild(local_98,node);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&groupName);
    pTVar1 = (TestContext *)&pTVar1[0x2aaaaaa].m_testResultDesc._M_string_length;
  }
  return;
}

Assistant:

void createTopologyGroups (tcu::TestCaseGroup* testGroup, const DrawCommandType cmdType)
{
	for (deUint32 idx = 0; idx != vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++idx)
	{
		const vk::VkPrimitiveTopology	topology	= vk::VkPrimitiveTopology(idx);
		const std::string				groupName	= de::toLower(getPrimitiveTopologyName(topology)).substr(22);
		addTestGroup(testGroup, groupName, "Testcases with a specific topology.", populateSubGroup, TestCaseParams(cmdType, topology));
	}
}